

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

bool __thiscall
Protocol::MQTT::V5::Properties::checkPropertiesFor(Properties *this,ControlPacketType type)

{
  PropertyBase *pPVar1;
  bool bVar2;
  bool bVar3;
  PropertyBase **ppPVar4;
  
  bVar2 = check(this);
  if (bVar2) {
    ppPVar4 = &this->head;
    do {
      pPVar1 = *ppPVar4;
      bVar2 = pPVar1 == (PropertyBase *)0x0;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = isAllowedProperty((uint)pPVar1->type,type);
      ppPVar4 = &pPVar1->next;
    } while (bVar3);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool checkPropertiesFor(const ControlPacketType type) const
                {
                    if (!check()) return false;
                    PropertyBase * u = head;
                    while (u) { if (!isAllowedProperty((PropertyType)u->type, type)) return false; u = u->next; }
                    return true;
                }